

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O1

void __thiscall read_point_le::operator()(read_point_le *this,way_point_le *point,xr_reader *r)

{
  float *pfVar1;
  uint32_t *puVar2;
  uint16_t *puVar3;
  
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (point->super_way_point).position.field_0.field_0.x = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (point->super_way_point).position.field_0.field_0.y = *pfVar1;
  pfVar1 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar1 + 1);
  (point->super_way_point).position.field_0.field_0.z = *pfVar1;
  puVar2 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
  (point->super_way_point).flags = *puVar2;
  puVar3 = (r->field_2).m_p_u16;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  point->id = *puVar3;
  xray_re::xr_reader::r_sz(r,(string *)point);
  return;
}

Assistant:

void operator()(way_point_le& point, xr_reader& r) {
	r.r_fvector3(point.position);
	point.flags = r.r_u32();
	point.id = r.r_u16();
	r.r_sz(point.name);
}